

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

ssize_t __thiscall zmq::pipe_t::read(pipe_t *this,int __fd,void *__buf,size_t __nbytes)

{
  uint64_t *puVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  undefined7 uVar7;
  pipe_t *ppVar6;
  undefined7 uVar8;
  pipe_t *extraout_RAX;
  pipe_t *extraout_RAX_00;
  undefined4 in_register_00000034;
  msg_t *this_00;
  msg_t *pmVar9;
  uint64_t in_stack_00000018;
  int rc;
  pipe_t *in_stack_00000020;
  object_t *in_stack_00000028;
  undefined7 in_stack_ffffffffffffffd0;
  bool bVar10;
  undefined1 uVar11;
  undefined1 local_1;
  
  this_00 = (msg_t *)CONCAT44(in_register_00000034,__fd);
  uVar7 = (undefined7)((ulong)this >> 8);
  ppVar6 = (pipe_t *)(CONCAT71(uVar7,this->_in_active) ^ 0xff);
  if (((ulong)ppVar6 & 1) == 0) {
    bVar10 = false;
    uVar8 = 0;
    if (this->_state != active) {
      bVar10 = this->_state != waiting_for_delimiter;
      uVar8 = uVar7;
    }
    ppVar6 = (pipe_t *)CONCAT71(uVar8,bVar10);
    if (bVar10 == false) {
      uVar11 = 0;
      while( true ) {
        pmVar9 = this_00;
        uVar4 = (*this->_in_pipe->_vptr_ypipe_base_t[6])();
        iVar5 = (int)pmVar9;
        if ((uVar4 & 1) == 0) break;
        bVar10 = msg_t::is_credential(this_00);
        if (!bVar10) {
          bVar10 = msg_t::is_delimiter(this_00);
          if (bVar10) {
            process_delimiter((pipe_t *)CONCAT17(uVar11,in_stack_ffffffffffffffd0));
            local_1 = 0;
            ppVar6 = extraout_RAX;
          }
          else {
            bVar3 = msg_t::flags(this_00);
            if (((bVar3 & 1) == 0) && (bVar10 = msg_t::is_routing_id(this_00), !bVar10)) {
              this->_msgs_read = this->_msgs_read + 1;
            }
            if ((0 < this->_lwm) &&
               (puVar1 = &this->_msgs_read, piVar2 = &this->_lwm,
               this = (pipe_t *)(*puVar1 / (ulong)(long)*piVar2),
               *puVar1 % (ulong)(long)*piVar2 == 0)) {
              object_t::send_activate_write(in_stack_00000028,in_stack_00000020,in_stack_00000018);
              this = extraout_RAX_00;
            }
            local_1 = 1;
            ppVar6 = this;
          }
          goto LAB_001f1e37;
        }
        iVar5 = msg_t::close(this_00,iVar5);
        if (iVar5 != 0) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/pipe.cpp"
                  ,0xd5);
          fflush(_stderr);
          zmq_abort((char *)0x1f1d9a);
        }
      }
      this->_in_active = false;
      local_1 = 0;
      ppVar6 = this;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_001f1e37:
  return CONCAT71((int7)((ulong)ppVar6 >> 8),local_1);
}

Assistant:

bool zmq::pipe_t::read (msg_t *msg_)
{
    if (unlikely (!_in_active))
        return false;
    if (unlikely (_state != active && _state != waiting_for_delimiter))
        return false;

    while (true) {
        if (!_in_pipe->read (msg_)) {
            _in_active = false;
            return false;
        }

        //  If this is a credential, ignore it and receive next message.
        if (unlikely (msg_->is_credential ())) {
            const int rc = msg_->close ();
            zmq_assert (rc == 0);
        } else {
            break;
        }
    }

    //  If delimiter was read, start termination process of the pipe.
    if (msg_->is_delimiter ()) {
        process_delimiter ();
        return false;
    }

    if (!(msg_->flags () & msg_t::more) && !msg_->is_routing_id ())
        _msgs_read++;

    if (_lwm > 0 && _msgs_read % _lwm == 0)
        send_activate_write (_peer, _msgs_read);

    return true;
}